

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall
ktx::ValidationContext::
error<unsigned_int&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,std::__cxx11::string&,int,unsigned_char&,int,int,int,int,int,int>
          (ValidationContext *this,IssueError *issue,uint *args,uchar *args_1,uchar *args_2,
          uchar *args_3,uchar *args_4,uchar *args_5,uchar *args_6,uchar *args_7,uchar *args_8,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_9,int *args_10,
          uchar *args_11,int *args_12,int *args_13,int *args_14,int *args_15,int *args_16,
          int *args_17)

{
  string_view fmt;
  format_args args_18;
  allocator<char> local_2f1;
  ulong local_2f0;
  ulong local_2e8;
  ulong local_2e0;
  ulong local_2d8;
  v10 *local_2d0;
  char *local_2c8;
  undefined1 local_2c0 [40];
  string local_298;
  ulong local_278 [2];
  undefined4 local_268;
  ulong local_258;
  undefined4 local_248;
  ulong local_238;
  undefined4 local_228;
  ulong local_218;
  undefined4 local_208;
  ulong local_1f8;
  undefined4 local_1e8;
  ulong local_1d8;
  undefined4 local_1c8;
  ulong local_1b8;
  undefined4 local_1a8;
  ulong local_198;
  undefined4 local_188;
  ulong local_178;
  undefined4 local_168;
  pointer local_158;
  size_type sStack_150;
  undefined4 local_148;
  ulong local_138;
  undefined4 local_128;
  ulong local_118;
  undefined4 local_108;
  ulong local_f8;
  undefined4 local_e8;
  ulong local_d8;
  undefined4 local_c8;
  ulong local_b8;
  undefined4 local_a8;
  ulong local_98;
  undefined4 local_88;
  ulong local_78;
  undefined4 local_68;
  ulong local_58;
  undefined4 local_48;
  
  this->numError = this->numError + 1;
  this->returnCode = 3;
  local_2c0[0] = (issue->super_Issue).type;
  local_2c0._2_2_ = (issue->super_Issue).id;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)(local_2c0 + 8),&(issue->super_Issue).message,&local_2f1);
  local_158 = (args_9->_M_dataplus)._M_p;
  sStack_150 = args_9->_M_string_length;
  local_2c8 = (char *)(issue->super_Issue).detailsFmt._M_len;
  local_2d0 = (v10 *)(issue->super_Issue).detailsFmt._M_str;
  local_278[0] = (ulong)*args;
  local_258 = (ulong)*args_1;
  local_238 = (ulong)*args_2;
  local_218 = (ulong)*args_3;
  local_1f8 = (ulong)*args_4;
  local_1d8 = (ulong)*args_5;
  local_1b8 = (ulong)*args_6;
  local_198 = (ulong)*args_7;
  local_178 = (ulong)*args_8;
  local_138 = (ulong)(uint)*args_10;
  local_2d8 = (ulong)*args_11;
  local_2e0 = (ulong)(uint)*args_12;
  local_2e8 = (ulong)(uint)*args_13;
  local_2f0 = (ulong)(uint)*args_14;
  local_98 = (ulong)(uint)*args_15;
  local_78 = (ulong)(uint)*args_16;
  local_58 = (ulong)(uint)*args_17;
  local_268 = 2;
  local_148 = 0xd;
  local_128 = 1;
  fmt.size_ = 0x8000000000000012;
  fmt.data_ = local_2c8;
  args_18.field_1._0_4_ = *args_10;
  args_18.desc_ = (unsigned_long_long)local_278;
  args_18.field_1._4_4_ = 0;
  local_248 = local_268;
  local_228 = local_268;
  local_208 = local_268;
  local_1e8 = local_268;
  local_1c8 = local_268;
  local_1a8 = local_268;
  local_188 = local_268;
  local_168 = local_268;
  local_118 = local_2d8;
  local_108 = local_268;
  local_f8 = local_2e0;
  local_e8 = local_128;
  local_d8 = local_2e8;
  local_c8 = local_128;
  local_b8 = local_2f0;
  local_a8 = local_128;
  local_88 = local_128;
  local_68 = local_128;
  local_48 = local_128;
  ::fmt::v10::vformat_abi_cxx11_(&local_298,local_2d0,fmt,args_18);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()
            (&this->callback,(ValidationReport *)local_2c0);
  ValidationReport::~ValidationReport((ValidationReport *)local_2c0);
  return;
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }